

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O1

int init_climate_seed(DoublePerlinNoise *dpn,PerlinNoise *oct,uint64_t xlo,uint64_t xhi,int large,
                     int nptype,int nmax)

{
  int iVar1;
  double *amplitudes;
  uint omin;
  bool bVar2;
  Xoroshiro local_10;
  
  switch(nptype) {
  case 0:
    bVar2 = large == 0;
    local_10.lo = 0x944b0073edf549db;
    if (bVar2) {
      local_10.lo = 0x5c7e6b29735f0d7f;
    }
    local_10.hi = 0x4ff44347e9d22b96;
    if (bVar2) {
      local_10.hi = 0xf7d86f1bbc734988;
    }
    omin = (uint)bVar2 * 2 | 0xfffffff4;
    amplitudes = init_climate_seed::amp_1;
    goto LAB_001218d5;
  case 1:
    bVar2 = large == 0;
    local_10.lo = 0x71b8ab943dbd5301;
    if (bVar2) {
      local_10.lo = 0x81bb4d22e8dc168e;
    }
    local_10.hi = 0xbb63ddcf39ff7a2b;
    if (bVar2) {
      local_10.hi = 0xf1c8b4bea16303cd;
    }
    omin = (uint)bVar2 * 2 - 10;
    amplitudes = init_climate_seed::amp_2;
LAB_001218d5:
    local_10.hi = local_10.hi ^ xhi;
    local_10.lo = local_10.lo ^ xlo;
LAB_00121914:
    iVar1 = 6;
    break;
  case 2:
    bVar2 = large == 0;
    local_10.lo = 0x9a3f51a113fce8dc;
    if (bVar2) {
      local_10.lo = 0x83886c9d0ae3a662;
    }
    local_10.hi = 0xee2dbd157e5dcdad;
    if (bVar2) {
      local_10.hi = 0xafa638a61b42e8ad;
    }
    local_10.lo = local_10.lo ^ xlo;
    local_10.hi = local_10.hi ^ xhi;
    omin = (uint)bVar2 * 2 | 0xfffffff5;
    amplitudes = init_climate_seed::amp_3;
    iVar1 = 9;
    break;
  case 3:
    bVar2 = large == 0;
    local_10.lo = 0x8c984b1f8702a951;
    if (bVar2) {
      local_10.lo = 0xd02491e6058f6fd8;
    }
    local_10.hi = 0xead7b1f92bae535f;
    if (bVar2) {
      local_10.hi = 0x4792512c94c17a80;
    }
    local_10.lo = local_10.lo ^ xlo;
    local_10.hi = local_10.hi ^ xhi;
    omin = (uint)bVar2 * 2 | 0xfffffff5;
    amplitudes = init_climate_seed::amp_4;
    iVar1 = 5;
    break;
  case 4:
    local_10.lo = xlo ^ 0x80518cf6af25384;
    local_10.hi = xhi ^ 0x3f3dfb40a54febd5;
    amplitudes = init_climate_seed::amp;
    omin = 0xfffffffd;
    iVar1 = 4;
    break;
  case 5:
    local_10.lo = xlo ^ 0xefc8ef4d36102b34;
    local_10.hi = xhi ^ 0x1beeeb324a0f24ea;
    amplitudes = init_climate_seed::amp_5;
    omin = 0xfffffff9;
    goto LAB_00121914;
  default:
    printf("unsupported climate parameter %d\n",(ulong)(uint)nptype);
    exit(1);
  }
  iVar1 = xDoublePerlinInit(dpn,&local_10,oct,amplitudes,omin,iVar1,nmax);
  return iVar1;
}

Assistant:

static int init_climate_seed(
    DoublePerlinNoise *dpn, PerlinNoise *oct,
    uint64_t xlo, uint64_t xhi, int large, int nptype, int nmax
    )
{
    Xoroshiro pxr;
    int n = 0;

    switch (nptype)
    {
    case NP_SHIFT: {
        static const double amp[] = {1, 1, 1, 0};
        // md5 "minecraft:offset"
        pxr.lo = xlo ^ 0x080518cf6af25384;
        pxr.hi = xhi ^ 0x3f3dfb40a54febd5;
        n += xDoublePerlinInit(dpn, &pxr, oct, amp, -3, 4, nmax);
        } break;

    case NP_TEMPERATURE: {
        static const double amp[] = {1.5, 0, 1, 0, 0, 0};
        // md5 "minecraft:temperature" or "minecraft:temperature_large"
        pxr.lo = xlo ^ (large ? 0x944b0073edf549db : 0x5c7e6b29735f0d7f);
        pxr.hi = xhi ^ (large ? 0x4ff44347e9d22b96 : 0xf7d86f1bbc734988);
        n += xDoublePerlinInit(dpn, &pxr, oct, amp, large ? -12 : -10, 6, nmax);
        } break;

    case NP_HUMIDITY: {
        static const double amp[] = {1, 1, 0, 0, 0, 0};
        // md5 "minecraft:vegetation" or "minecraft:vegetation_large"
        pxr.lo = xlo ^ (large ? 0x71b8ab943dbd5301 : 0x81bb4d22e8dc168e);
        pxr.hi = xhi ^ (large ? 0xbb63ddcf39ff7a2b : 0xf1c8b4bea16303cd);
        n += xDoublePerlinInit(dpn, &pxr, oct, amp, large ? -10 : -8, 6, nmax);
        } break;

    case NP_CONTINENTALNESS: {
        static const double amp[] = {1, 1, 2, 2, 2, 1, 1, 1, 1};
        // md5 "minecraft:continentalness" or "minecraft:continentalness_large"
        pxr.lo = xlo ^ (large ? 0x9a3f51a113fce8dc : 0x83886c9d0ae3a662);
        pxr.hi = xhi ^ (large ? 0xee2dbd157e5dcdad : 0xafa638a61b42e8ad);
        n += xDoublePerlinInit(dpn, &pxr, oct, amp, large ? -11 : -9, 9, nmax);
        } break;

    case NP_EROSION: {
        static const double amp[] = {1, 1, 0, 1, 1};
        // md5 "minecraft:erosion" or "minecraft:erosion_large"
        pxr.lo = xlo ^ (large ? 0x8c984b1f8702a951 : 0xd02491e6058f6fd8);
        pxr.hi = xhi ^ (large ? 0xead7b1f92bae535f : 0x4792512c94c17a80);
        n += xDoublePerlinInit(dpn, &pxr, oct, amp, large ? -11 : -9, 5, nmax);
        } break;

    case NP_WEIRDNESS: {
        static const double amp[] = {1, 2, 1, 0, 0, 0};
        // md5 "minecraft:ridge"
        pxr.lo = xlo ^ 0xefc8ef4d36102b34;
        pxr.hi = xhi ^ 0x1beeeb324a0f24ea;
        n += xDoublePerlinInit(dpn, &pxr, oct, amp, -7, 6, nmax);
        } break;

    default:
        printf("unsupported climate parameter %d\n", nptype);
        exit(1);
    }
    return n;
}